

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderInput.cpp
# Opt level: O2

int __thiscall
glcts::GeometryShader_gl_PointSize_ValueTest::init
          (GeometryShader_gl_PointSize_ValueTest *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  GLuint GVar4;
  deUint32 dVar5;
  int extraout_EAX;
  undefined4 extraout_var;
  TestError *this_01;
  pointer_____offset_0x10___ *ppuVar7;
  undefined8 uVar8;
  GLfloat point_size_range [2];
  undefined1 local_1a0 [384];
  long lVar6;
  
  TestCaseBase::init(&this->super_TestCaseBase,ctx);
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_01,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
               ,0x382);
  }
  else if ((this->super_TestCaseBase).m_is_geometry_shader_point_size_supported == false) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_01,
               "Geometry shader point size functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
               ,0x387);
  }
  else {
    iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar6 = CONCAT44(extraout_var,iVar2);
    point_size_range[0] = 0.0;
    point_size_range[1] = 0.0;
    uVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    uVar8 = 0xb12;
    if ((uVar3 & 0x300) == 0) {
      uVar8 = 0x846d;
    }
    (**(code **)(lVar6 + 0x818))(uVar8,point_size_range);
    if (8.0 <= point_size_range[1]) {
      uVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
      if ((uVar3 & 0x300) != 0) {
        (**(code **)(lVar6 + 0x5e0))(0x8642);
      }
      GVar4 = (**(code **)(lVar6 + 0x3c8))();
      this->m_program_object_id = GVar4;
      GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
      this->m_fragment_shader_id = GVar4;
      GVar4 = (**(code **)(lVar6 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER)
      ;
      this->m_geometry_shader_id = GVar4;
      GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
      this->m_vertex_shader_id = GVar4;
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"Failed to create program",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                      ,0x3ae);
      bVar1 = TestCaseBase::buildProgram
                        (&this->super_TestCaseBase,this->m_program_object_id,
                         this->m_fragment_shader_id,1,&m_fragment_shader_code,
                         this->m_geometry_shader_id,1,&m_geometry_shader_code,
                         this->m_vertex_shader_id,1,&m_vertex_shader_code,(bool *)0x0);
      if (bVar1) {
        (**(code **)(lVar6 + 0x6f8))(1,&this->m_color_texture_id);
        (**(code **)(lVar6 + 0x6d0))(1,&this->m_framebuffer_object_id);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"Could not create framebuffer",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                        ,0x3bd);
        bVar1 = TestCaseBase::setupFramebufferWithTextureAsAttachment
                          (&this->super_TestCaseBase,this->m_framebuffer_object_id,
                           this->m_color_texture_id,0x8058,0x10,0x10);
        if (bVar1) {
          (**(code **)(lVar6 + 0x708))(1,&this->m_vertex_array_object_id);
          (**(code **)(lVar6 + 0xd8))(this->m_vertex_array_object_id);
          dVar5 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar5,"Could not create vertex array object",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                          ,0x3c9);
          return extraout_EAX;
        }
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Failed to setup framebuffer",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                   ,0x3c2);
      }
      else {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Could not create program from valid vertex/geometry/fragment shader",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                   ,0x3b6);
      }
      ppuVar7 = &tcu::TestError::typeinfo;
      goto LAB_00cdff10;
    }
    local_1a0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,
                    "Test requires a minimum maximum point size of 8, implementation reports a maximum of : "
                   );
    std::ostream::operator<<(this_00,point_size_range[1]);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_01,"Not supported point size",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
               ,0x39f);
  }
  ppuVar7 = &tcu::NotSupportedError::typeinfo;
LAB_00cdff10:
  __cxa_throw(this_01,ppuVar7,tcu::Exception::~Exception);
}

Assistant:

void GeometryShader_gl_PointSize_ValueTest::init()
{
	/* Initialize Base */
	TestCaseBase::init();

	/* This test should only run if EXT_geometry_shader and EXT_geometry_point_size both are supported */
	if (true != m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	if (true != m_is_geometry_shader_point_size_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_POINT_SIZE_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* GL */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Verify that point size range is supported */
	glw::GLfloat point_size_range[2] = { 0 };

	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		gl.getFloatv(GL_POINT_SIZE_RANGE, point_size_range);
	}
	else
	{
		gl.getFloatv(GL_ALIASED_POINT_SIZE_RANGE, point_size_range);
	}

	if (8.0f > point_size_range[1])
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Test requires a minimum maximum point size of 8, implementation reports a maximum of : "
						   << point_size_range[1] << tcu::TestLog::EndMessage;

		throw tcu::NotSupportedError("Not supported point size", "", __FILE__, __LINE__);
	}

	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		gl.enable(GL_PROGRAM_POINT_SIZE);
	}

	/* Create program and shaders */
	m_program_object_id = gl.createProgram();

	m_fragment_shader_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_geometry_shader_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_vertex_shader_id   = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create program");

	/* Build program */
	if (false == buildProgram(m_program_object_id, m_fragment_shader_id, 1 /* fragment shader parts number */,
							  &m_fragment_shader_code, m_geometry_shader_id, 1 /* geometry shader parts number */,
							  &m_geometry_shader_code, m_vertex_shader_id, 1 /* vertex shader parts number */,
							  &m_vertex_shader_code))
	{
		TCU_FAIL("Could not create program from valid vertex/geometry/fragment shader");
	}

	/* Set up texture object and a FBO */
	gl.genTextures(1, &m_color_texture_id);
	gl.genFramebuffers(1, &m_framebuffer_object_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create framebuffer");

	if (false == setupFramebufferWithTextureAsAttachment(m_framebuffer_object_id, m_color_texture_id, GL_RGBA8,
														 m_texture_width, m_texture_height))
	{
		TCU_FAIL("Failed to setup framebuffer");
	}

	/* Set up a vertex array object */
	gl.genVertexArrays(1, &m_vertex_array_object_id);
	gl.bindVertexArray(m_vertex_array_object_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create vertex array object");
}